

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereRightJoinLoop(WhereInfo *pWInfo,int iLevel,WhereLevel *pLevel)

{
  Parse *pParse_00;
  Vdbe *v_00;
  WhereRightJoin *pWVar1;
  WhereLoop *pWVar2;
  ulong uVar3;
  Table *pTab_00;
  int regOut;
  int p2;
  int iVar4;
  WhereTerm *pWVar5;
  Expr *pRight;
  WhereInfo *pWInfo_00;
  Index *pIVar6;
  int iCol;
  Index *pPk;
  int iPk;
  Table *pTab;
  int addrCont;
  int jmp;
  int nPk;
  int r;
  int iCur;
  WhereTerm *pTerm;
  int iIdxCur;
  int k;
  Bitmask mAll;
  SrcList sFrom;
  SrcItem *pTabItem;
  WhereLoop *pLoop;
  WhereInfo *pSubWInfo;
  WhereClause *pWC;
  Expr *pSubWhere;
  WhereRightJoin *pRJ;
  Vdbe *v;
  Parse *pParse;
  WhereLevel *pLevel_local;
  int iLevel_local;
  WhereInfo *pWInfo_local;
  
  pParse_00 = pWInfo->pParse;
  v_00 = pParse_00->pVdbe;
  pWVar1 = pLevel->pRJ;
  pWC = (WhereClause *)0x0;
  pWVar2 = pLevel->pWLoop;
  sFrom.a[0].u2.pIBIndex = (Index *)(pWInfo->pTabList->a + pLevel->iFrom);
  _iIdxCur = 0;
  sqlite3VdbeExplain(pParse_00,'\x01',"RIGHT-JOIN %s",
                     ((Table *)(sFrom.a[0].u2.pIBIndex)->zColAff)->zName);
  for (pTerm._4_4_ = 0; pTerm._4_4_ < iLevel; pTerm._4_4_ = pTerm._4_4_ + 1) {
    _iIdxCur = (pWInfo->a[pTerm._4_4_].pWLoop)->maskSelf | _iIdxCur;
    sqlite3VdbeAddOp1(v_00,0x88,pWInfo->a[pTerm._4_4_].iTabCur);
    iVar4 = pWInfo->a[pTerm._4_4_].iIdxCur;
    if (iVar4 != 0) {
      sqlite3VdbeAddOp1(v_00,0x88,iVar4);
    }
  }
  if (((ulong)(sFrom.a[0].u2.pIBIndex)->aSortOrder & 0x4000000000) == 0) {
    uVar3 = pWVar2->maskSelf;
    pTerm._4_4_ = 0;
    while ((pTerm._4_4_ < (pWInfo->sWC).nTerm &&
           ((pWVar5 = (pWInfo->sWC).a + pTerm._4_4_, (pWVar5->wtFlags & 0x8002) == 0 ||
            (pWVar5->eOperator == 0x2000))))) {
      if (((pWVar5->prereqAll & ((uVar3 | _iIdxCur) ^ 0xffffffffffffffff)) == 0) &&
         ((pWVar5->pExpr->flags & 3) == 0)) {
        pRight = sqlite3ExprDup(pParse_00->db,pWVar5->pExpr,0);
        pWC = (WhereClause *)sqlite3ExprAnd(pParse_00,(Expr *)pWC,pRight);
      }
      pTerm._4_4_ = pTerm._4_4_ + 1;
    }
  }
  mAll._0_4_ = 1;
  mAll._4_4_ = 1;
  memcpy(&sFrom,sFrom.a[0].u2.pIBIndex,0x68);
  sFrom.a[0].regReturn._0_1_ = 0;
  pParse_00->withinRJSubrtn = pParse_00->withinRJSubrtn + '\x01';
  pWInfo_00 = sqlite3WhereBegin(pParse_00,(SrcList *)&mAll,(Expr *)pWC,(ExprList *)0x0,
                                (ExprList *)0x0,(Select *)0x0,0x1000,0);
  if (pWInfo_00 != (WhereInfo *)0x0) {
    iVar4 = pLevel->iTabCur;
    regOut = pParse_00->nMem + 1;
    pParse_00->nMem = regOut;
    p2 = sqlite3WhereContinueLabel(pWInfo_00);
    pTab_00 = (Table *)(sFrom.a[0].u2.pIBIndex)->zColAff;
    if ((pTab_00->tabFlags & 0x80) == 0) {
      sqlite3ExprCodeGetColumnOfTable(v_00,pTab_00,iVar4,-1,regOut);
      addrCont = 1;
    }
    else {
      pIVar6 = sqlite3PrimaryKeyIndex(pTab_00);
      addrCont = (int)pIVar6->nKeyCol;
      pParse_00->nMem = (addrCont - 1U) + pParse_00->nMem;
      for (pPk._4_4_ = 0; pPk._4_4_ < addrCont; pPk._4_4_ = pPk._4_4_ + 1) {
        sqlite3ExprCodeGetColumnOfTable
                  (v_00,pTab_00,iVar4,(int)pIVar6->aiColumn[pPk._4_4_],regOut + pPk._4_4_);
      }
    }
    iVar4 = sqlite3VdbeAddOp4Int(v_00,0x40,pWVar1->regBloom,0,regOut,addrCont);
    sqlite3VdbeAddOp4Int(v_00,0x1d,pWVar1->iMatch,p2,regOut,addrCont);
    sqlite3VdbeJumpHere(v_00,iVar4);
    sqlite3VdbeAddOp2(v_00,10,pWVar1->regReturn,pWVar1->addrSubrtn);
    sqlite3WhereEnd(pWInfo_00);
  }
  sqlite3ExprDelete(pParse_00->db,(Expr *)pWC);
  sqlite3VdbeExplainPop(pParse_00);
  pParse_00->withinRJSubrtn = pParse_00->withinRJSubrtn + 0xff;
  return;
}

Assistant:

void sqlite3WhereRightJoinLoop(
  WhereInfo *pWInfo,
  int iLevel,
  WhereLevel *pLevel
){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  WhereRightJoin *pRJ = pLevel->pRJ;
  Expr *pSubWhere = 0;
  WhereClause *pWC = &pWInfo->sWC;
  WhereInfo *pSubWInfo;
  WhereLoop *pLoop = pLevel->pWLoop;
  SrcItem *pTabItem = &pWInfo->pTabList->a[pLevel->iFrom];
  SrcList sFrom;
  Bitmask mAll = 0;
  int k;

  ExplainQueryPlan((pParse, 1, "RIGHT-JOIN %s", pTabItem->pTab->zName));
  sqlite3VdbeNoJumpsOutsideSubrtn(v, pRJ->addrSubrtn, pRJ->endSubrtn,
                                  pRJ->regReturn);
  for(k=0; k<iLevel; k++){
    int iIdxCur;
    mAll |= pWInfo->a[k].pWLoop->maskSelf;
    sqlite3VdbeAddOp1(v, OP_NullRow, pWInfo->a[k].iTabCur);
    iIdxCur = pWInfo->a[k].iIdxCur;
    if( iIdxCur ){
      sqlite3VdbeAddOp1(v, OP_NullRow, iIdxCur);
    }
  }
  if( (pTabItem->fg.jointype & JT_LTORJ)==0 ){
    mAll |= pLoop->maskSelf;
    for(k=0; k<pWC->nTerm; k++){
      WhereTerm *pTerm = &pWC->a[k];
      if( (pTerm->wtFlags & (TERM_VIRTUAL|TERM_SLICE))!=0
       && pTerm->eOperator!=WO_ROWVAL
      ){
        break;
      }
      if( pTerm->prereqAll & ~mAll ) continue;
      if( ExprHasProperty(pTerm->pExpr, EP_OuterON|EP_InnerON) ) continue;
      pSubWhere = sqlite3ExprAnd(pParse, pSubWhere,
                                 sqlite3ExprDup(pParse->db, pTerm->pExpr, 0));
    }
  }
  sFrom.nSrc = 1;
  sFrom.nAlloc = 1;
  memcpy(&sFrom.a[0], pTabItem, sizeof(SrcItem));
  sFrom.a[0].fg.jointype = 0;
  assert( pParse->withinRJSubrtn < 100 );
  pParse->withinRJSubrtn++;
  pSubWInfo = sqlite3WhereBegin(pParse, &sFrom, pSubWhere, 0, 0, 0,
                                WHERE_RIGHT_JOIN, 0);
  if( pSubWInfo ){
    int iCur = pLevel->iTabCur;
    int r = ++pParse->nMem;
    int nPk;
    int jmp;
    int addrCont = sqlite3WhereContinueLabel(pSubWInfo);
    Table *pTab = pTabItem->pTab;
    if( HasRowid(pTab) ){
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, -1, r);
      nPk = 1;
    }else{
      int iPk;
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      nPk = pPk->nKeyCol;
      pParse->nMem += nPk - 1;
      for(iPk=0; iPk<nPk; iPk++){
        int iCol = pPk->aiColumn[iPk];
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, iCol,r+iPk);
      }
    }
    jmp = sqlite3VdbeAddOp4Int(v, OP_Filter, pRJ->regBloom, 0, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeAddOp4Int(v, OP_Found, pRJ->iMatch, addrCont, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, jmp);
    sqlite3VdbeAddOp2(v, OP_Gosub, pRJ->regReturn, pRJ->addrSubrtn);
    sqlite3WhereEnd(pSubWInfo);
  }
  sqlite3ExprDelete(pParse->db, pSubWhere);
  ExplainQueryPlanPop(pParse);
  assert( pParse->withinRJSubrtn>0 );
  pParse->withinRJSubrtn--;
}